

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hxx
# Opt level: O1

size_t lineage::loadNodes(string *fileName,Problem *problem)

{
  pointer *ppNVar1;
  pointer pNVar2;
  pointer puVar3;
  iterator iVar4;
  iterator __position;
  unsigned_long uVar5;
  istream *piVar6;
  double *pdVar7;
  Node node;
  ifstream file;
  unsigned_long local_260;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_258;
  Node local_250;
  unsigned_long local_238 [65];
  
  pNVar2 = (problem->nodes).super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((problem->nodes).super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
      super__Vector_impl_data._M_finish != pNVar2) {
    (problem->nodes).super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = pNVar2;
  }
  puVar3 = (problem->node_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((problem->node_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar3) {
    (problem->node_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar3;
  }
  local_258 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&problem->node_offsets;
  local_238[0] = 0;
  iVar4._M_current =
       (problem->node_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (problem->node_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_258,iVar4,local_238);
  }
  else {
    *iVar4._M_current = 0;
    (problem->node_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  std::ifstream::ifstream(local_238,(string *)fileName,_S_in);
  local_260 = 0;
  while( true ) {
    piVar6 = (istream *)std::istream::operator>>((istream *)local_238,&local_250.t);
    piVar6 = (istream *)std::istream::operator>>(piVar6,&local_250.id);
    piVar6 = (istream *)std::istream::operator>>(piVar6,&local_250.cx);
    pdVar7 = (double *)std::istream::operator>>(piVar6,&local_250.cy);
    piVar6 = std::istream::_M_extract<double>(pdVar7);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    iVar4._M_current =
         (problem->node_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if ((long)iVar4._M_current -
        (long)(problem->node_offsets).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 == (long)local_250.t) {
      if (iVar4._M_current ==
          (problem->node_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(local_258,iVar4,&local_260);
      }
      else {
        *iVar4._M_current = local_260;
        (problem->node_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
    }
    __position._M_current =
         (problem->nodes).super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (problem->nodes).super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<lineage::Node,std::allocator<lineage::Node>>::
      _M_realloc_insert<lineage::Node_const&>
                ((vector<lineage::Node,std::allocator<lineage::Node>> *)problem,__position,
                 &local_250);
    }
    else {
      (__position._M_current)->probability_birth_termination =
           local_250.probability_birth_termination;
      (__position._M_current)->t = local_250.t;
      (__position._M_current)->id = local_250.id;
      (__position._M_current)->cx = local_250.cx;
      (__position._M_current)->cy = local_250.cy;
      ppNVar1 = &(problem->nodes).super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppNVar1 = *ppNVar1 + 1;
    }
    local_260 = local_260 + 1;
  }
  iVar4._M_current =
       (problem->node_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (problem->node_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>(local_258,iVar4,&local_260);
  }
  else {
    *iVar4._M_current = local_260;
    (problem->node_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  std::ifstream::close();
  uVar5 = local_260;
  std::ifstream::~ifstream(local_238);
  return uVar5;
}

Assistant:

inline
size_t loadNodes(const std::string& fileName, Problem& problem)
{
    problem.nodes.clear();
    problem.node_offsets.clear();
    problem.node_offsets.push_back(0);

    std::ifstream file(fileName);

    Node node;
    size_t counter = 0;
    while (file >> node.t >> node.id >> node.cx >> node.cy >> node.probability_birth_termination)
    {
        if (node.t == problem.node_offsets.size())
            problem.node_offsets.push_back(counter);

        problem.nodes.push_back(node);
        ++counter;
    }

    problem.node_offsets.push_back(counter);

    file.close();

    return counter;
}